

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_defer_has_queue(void)

{
  bool local_9;
  
  local_9 = true;
  if (((task_queue_urgent.reader == task_queue_urgent.writer) &&
      (local_9 = true, (task_queue_urgent.reader)->write == (task_queue_urgent.reader)->read)) &&
     (local_9 = true, task_queue_normal.reader == task_queue_normal.writer)) {
    local_9 = (task_queue_normal.reader)->write != (task_queue_normal.reader)->read;
  }
  return (int)local_9;
}

Assistant:

int fio_defer_has_queue(void) {
#if FIO_USE_URGENT_QUEUE
  return task_queue_urgent.reader != task_queue_urgent.writer ||
         task_queue_urgent.reader->write != task_queue_urgent.reader->read ||
         task_queue_normal.reader != task_queue_normal.writer ||
         task_queue_normal.reader->write != task_queue_normal.reader->read;
#else
  return task_queue_normal.reader != task_queue_normal.writer ||
         task_queue_normal.reader->write != task_queue_normal.reader->read;
#endif
}